

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# support.c
# Opt level: O3

void fwrite32le(FILE *fp,uint32_t w)

{
  uint8_t le [4];
  undefined1 local_4 [4];
  
  fwritex(fp,local_4,4);
  return;
}

Assistant:

void fwrite32le(FILE *fp,uint32_t w)
/* write a little endian 32 bit word */
{
  uint8_t le[4];

  le[0] = w & 0xff;
  le[1] = (w>>8) & 0xff;
  le[2] = (w>>16) & 0xff;
  le[3] = (w>>24) & 0xff;
  fwritex(fp,le,4);
}